

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O2

string * __thiscall
iDynTree::LinkPositions::toString_abi_cxx11_
          (string *__return_storage_ptr__,LinkPositions *this,Model *model)

{
  pointer pTVar1;
  pointer pTVar2;
  ostream *poVar3;
  long linkIndex;
  string local_1f8 [32];
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pTVar1 = (this->m_linkPos).
           super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar2 = (this->m_linkPos).
           super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (linkIndex = 0; ((long)pTVar1 - (long)pTVar2) / 0x60 != linkIndex; linkIndex = linkIndex + 1)
  {
    poVar3 = std::operator<<(local_1a8,"Position for link ");
    Model::getLinkName_abi_cxx11_(&local_1d8,model,linkIndex);
    poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
    poVar3 = std::operator<<(poVar3,":");
    iDynTree::Transform::toString_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_1f8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string LinkPositions::toString(const Model& model) const
{
   std::stringstream ss;

    size_t nrOfLinks = this->getNrOfLinks();
    for(size_t l=0; l < nrOfLinks; l++)
    {
        ss << "Position for link " << model.getLinkName(l) << ":" << this->operator()(l).toString() << std::endl;
    }
    return ss.str();
}